

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpub.cpp
# Opt level: O1

void __thiscall
zmq::xpub_t::xattach_pipe(xpub_t *this,pipe_t *pipe_,bool subscribe_to_all_,bool locally_initiated_)

{
  int iVar1;
  size_t sVar2;
  ssize_t sVar3;
  undefined7 in_register_00000009;
  pipe_t *__n;
  EVP_PKEY_CTX *src;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  pipe_t *ctx;
  msg_t copy;
  msg_t mStack_68;
  
  __n = (pipe_t *)CONCAT71(in_register_00000009,locally_initiated_);
  if (pipe_ == (pipe_t *)0x0) {
    xattach_pipe();
  }
  ctx = pipe_;
  dist_t::attach(&this->_dist,pipe_);
  if (subscribe_to_all_) {
    ctx = (pipe_t *)0x0;
    __n = pipe_;
    generic_mtrie_t<zmq::pipe_t>::add(&this->_subscriptions,(prefix_t)0x0,0,pipe_);
  }
  sVar2 = msg_t::size(&this->_welcome_msg);
  if (sVar2 != 0) {
    msg_t::init(&mStack_68,(EVP_PKEY_CTX *)ctx);
    iVar1 = msg_t::copy(&mStack_68,(EVP_PKEY_CTX *)&this->_welcome_msg,src);
    __buf = extraout_RDX;
    if (iVar1 != 0) {
      xattach_pipe();
      __buf = extraout_RDX_00;
    }
    sVar3 = pipe_t::write(pipe_,(int)&mStack_68,__buf,(size_t)__n);
    if ((char)sVar3 == '\0') {
      xattach_pipe();
    }
    pipe_t::flush(pipe_);
  }
  xread_activated(this,pipe_);
  return;
}

Assistant:

void zmq::xpub_t::xattach_pipe (pipe_t *pipe_,
                                bool subscribe_to_all_,
                                bool locally_initiated_)
{
    LIBZMQ_UNUSED (locally_initiated_);

    zmq_assert (pipe_);
    _dist.attach (pipe_);

    //  If subscribe_to_all_ is specified, the caller would like to subscribe
    //  to all data on this pipe, implicitly.
    if (subscribe_to_all_)
        _subscriptions.add (NULL, 0, pipe_);

    // if welcome message exists, send a copy of it
    if (_welcome_msg.size () > 0) {
        msg_t copy;
        copy.init ();
        const int rc = copy.copy (_welcome_msg);
        errno_assert (rc == 0);
        const bool ok = pipe_->write (&copy);
        zmq_assert (ok);
        pipe_->flush ();
    }

    //  The pipe is active when attached. Let's read the subscriptions from
    //  it, if any.
    xread_activated (pipe_);
}